

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  duration<double,_std::ratio<1L,_1L>_> dVar7;
  duration<double,_std::ratio<1L,_1L>_> dVar8;
  duration<double,_std::ratio<1L,_1L>_> dVar9;
  duration<double,_std::ratio<1L,_1L>_> dVar10;
  duration<double,_std::ratio<1L,_1L>_> dVar11;
  duration<double,_std::ratio<1L,_1L>_> dVar12;
  duration<double,_std::ratio<1L,_1L>_> dVar13;
  double local_30;
  
  iVar1 = 1000;
  if (1 < argc) {
    iVar1 = atoi(argv[1]);
  }
  local_30 = (double)testOld_nobias<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar5 = 0;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar5 = iVar1;
    iVar4 = iVar1;
  }
  while (iVar5 != 0) {
    dVar7 = testOld_nobias<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
    dVar8 = testOld_nobias<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
    dVar9 = testOld_nobias<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
    dVar10 = testOld_nobias<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testOld_nobias<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testOld_nobias<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
    iVar5 = iVar5 + -1;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of SSSE3 without bias took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30 = (double)testOld<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    dVar7 = testOld<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
    dVar8 = testOld<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
    dVar9 = testOld<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
    dVar10 = testOld<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testOld<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testOld<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of SSSE3 took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30 = (double)testOld<intgemm::SSSE3::Kernels8>(1,0x40,8);
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    dVar7 = testNew<intgemm::SSSE3::Kernels8>(8,0x100,0x100);
    dVar8 = testNew<intgemm::SSSE3::Kernels8>(8,0x800,0x100);
    dVar9 = testNew<intgemm::SSSE3::Kernels8>(0x140,0x100,0x100);
    dVar10 = testNew<intgemm::SSSE3::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testNew<intgemm::SSSE3::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testNew<intgemm::SSSE3::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of Shifted SSSE3 took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30 = (double)testOld_nobias<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    dVar7 = testOld_nobias<intgemm::AVX2::Kernels8>(8,0x100,0x100);
    dVar8 = testOld_nobias<intgemm::AVX2::Kernels8>(8,0x800,0x100);
    dVar9 = testOld_nobias<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
    dVar10 = testOld_nobias<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testOld_nobias<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testOld_nobias<intgemm::AVX2::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of AVX2 without bias took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30 = (double)testOld<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    dVar7 = testOld<intgemm::AVX2::Kernels8>(8,0x100,0x100);
    dVar8 = testOld<intgemm::AVX2::Kernels8>(8,0x800,0x100);
    dVar9 = testOld<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
    dVar10 = testOld<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testOld<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testOld<intgemm::AVX2::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of AVX2 took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_30 = (double)testOld<intgemm::AVX2::Kernels8>(1,0x40,8);
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    dVar7 = testNew<intgemm::AVX2::Kernels8>(8,0x100,0x100);
    dVar8 = testNew<intgemm::AVX2::Kernels8>(8,0x800,0x100);
    dVar9 = testNew<intgemm::AVX2::Kernels8>(0x140,0x100,0x100);
    dVar10 = testNew<intgemm::AVX2::Kernels8>(0x1d8,0x100,0x100);
    dVar11 = testNew<intgemm::AVX2::Kernels8>(0xf8,0x100,0x100);
    dVar12 = testNew<intgemm::AVX2::Kernels8>(200,0x100,0x100);
    local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::operator<<(poVar2," iterations of Shifted AVX2 took: ");
  poVar2 = std::ostream::_M_insert<double>(local_30);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar5 = intgemm::kCPU;
  if (3 < intgemm::kCPU) {
    local_30 = (double)testOld_nobias<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar3 = iVar4;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      dVar7 = testOld_nobias<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
      dVar8 = testOld_nobias<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
      dVar9 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
      dVar10 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
      dVar11 = testOld_nobias<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
      dVar12 = testOld_nobias<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
      local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r
      ;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," iterations of AVX512 without bias took: ");
    poVar2 = std::ostream::_M_insert<double>(local_30);
    poVar2 = std::operator<<(poVar2," seconds.");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_30 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar3 = iVar4;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      dVar7 = testOld<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
      dVar8 = testOld<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
      dVar9 = testOld<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
      dVar10 = testOld<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
      dVar11 = testOld<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
      dVar12 = testOld<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
      local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r
      ;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," iterations of AVX512 took: ");
    poVar2 = std::ostream::_M_insert<double>(local_30);
    poVar2 = std::operator<<(poVar2," seconds.");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_30 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
    iVar3 = iVar4;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      dVar7 = testNew<intgemm::AVX512BW::Kernels8>(8,0x100,0x100);
      dVar8 = testNew<intgemm::AVX512BW::Kernels8>(8,0x800,0x100);
      dVar9 = testNew<intgemm::AVX512BW::Kernels8>(0x140,0x100,0x100);
      dVar10 = testNew<intgemm::AVX512BW::Kernels8>(0x1d8,0x100,0x100);
      dVar11 = testNew<intgemm::AVX512BW::Kernels8>(0xf8,0x100,0x100);
      dVar12 = testNew<intgemm::AVX512BW::Kernels8>(200,0x100,0x100);
      local_30 = dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r
      ;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," iterations of Shifted AVX512 took: ");
    poVar2 = std::ostream::_M_insert<double>(local_30);
    poVar2 = std::operator<<(poVar2," seconds.");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (iVar5 != 4) {
      local_30 = (double)testOld_nobias<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      iVar5 = iVar4;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        dVar7 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
        dVar8 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
        dVar9 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
        dVar10 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
        dVar11 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
        dVar12 = testOld_nobias<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
        local_30 = dVar12.__r +
                   dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar2," iterations of AVX512VNNI without bias took: ");
      poVar2 = std::ostream::_M_insert<double>(local_30);
      poVar2 = std::operator<<(poVar2," seconds.");
      std::endl<char,std::char_traits<char>>(poVar2);
      local_30 = (double)testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      iVar5 = iVar4;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        dVar7 = testOld<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
        dVar8 = testOld<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
        dVar9 = testOld<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
        dVar10 = testOld<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
        dVar11 = testOld<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
        dVar12 = testOld<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
        local_30 = dVar12.__r +
                   dVar11.__r + dVar10.__r + dVar9.__r + dVar8.__r + local_30 + dVar7.__r;
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar2," iterations of AVX512VNNI took: ");
      poVar2 = std::ostream::_M_insert<double>(local_30);
      poVar2 = std::operator<<(poVar2," seconds.");
      std::endl<char,std::char_traits<char>>(poVar2);
      dVar7 = testOld<intgemm::AVX512BW::Kernels8>(1,0x40,8);
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        dVar8 = testNew<intgemm::AVX512VNNI::Kernels8>(8,0x100,0x100);
        dVar9 = testNew<intgemm::AVX512VNNI::Kernels8>(8,0x800,0x100);
        dVar10 = testNew<intgemm::AVX512VNNI::Kernels8>(0x140,0x100,0x100);
        dVar11 = testNew<intgemm::AVX512VNNI::Kernels8>(0x1d8,0x100,0x100);
        dVar12 = testNew<intgemm::AVX512VNNI::Kernels8>(0xf8,0x100,0x100);
        dVar13 = testNew<intgemm::AVX512VNNI::Kernels8>(200,0x100,0x100);
        dVar7.__r = dVar13.__r +
                    dVar12.__r + dVar11.__r + dVar10.__r + dVar9.__r + dVar7.__r + dVar8.__r;
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::operator<<(poVar2," iterations of Shifted AVX512VNNI took: ");
      poVar2 = std::ostream::_M_insert<double>(dVar7.__r);
      poVar2 = std::operator<<(poVar2," seconds.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
	int repeat = 1000;
	if (argc > 1) {
		repeat = atoi(argv[1]);
	}

	std::chrono::duration<double> oldSSSE3_nobias = testOld_nobias<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3_nobias += testOld_nobias<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 without bias took: " << oldSSSE3_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(8, 2048, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(320, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(472, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(248, 256, 256);
		oldSSSE3 += testOld<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of SSSE3 took: " << oldSSSE3.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeSSSE3 = testOld<SSSE3::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(8, 2048, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(320, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(472, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(248, 256, 256);
		newTimeSSSE3 += testNew<SSSE3::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted SSSE3 took: " << newTimeSSSE3.count() << " seconds." << std::endl;

#ifdef INTGEMM_COMPILER_SUPPORTS_AVX2
	std::chrono::duration<double> oldAVX2_nobias = testOld_nobias<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(320, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(472, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(248, 256, 256);
		oldAVX2_nobias += testOld_nobias<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 without bias took: " << oldAVX2_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX2 += testOld<AVX2::Kernels8>(8, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(8, 2048, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(320, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(472, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(248, 256, 256);
		oldAVX2 += testOld<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX2 took: " << oldAVX2.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX2 = testOld<AVX2::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(8, 2048, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(320, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(472, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(248, 256, 256);
		newTimeAVX2 += testNew<AVX2::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX2 took: " << newTimeAVX2.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512BW
	if (kCPU < CPUType::AVX512BW) return 0;
	std::chrono::duration<double> oldAVX512_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512_nobias += testOld_nobias<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 without bias took: " << oldAVX512_nobias.count() << " seconds." << std::endl;

	std::chrono::duration<double> oldAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(8, 2048, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(320, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(472, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(248, 256, 256);
		oldAVX512 += testOld<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of AVX512 took: " << oldAVX512.count() << " seconds." << std::endl;

	std::chrono::duration<double> newTimeAVX512 = testOld<AVX512BW::Kernels8>(1, 64, 8);
	for (int i = 0; i<repeat; i++) {
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(8, 2048, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(320, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(472, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(248, 256, 256);
		newTimeAVX512 += testNew<AVX512BW::Kernels8>(200, 256, 256);
	}

	std::cout << repeat << " iterations of Shifted AVX512 took: " << newTimeAVX512.count() << " seconds." << std::endl;
#endif
#ifdef INTGEMM_COMPILER_SUPPORTS_AVX512VNNI
  if (kCPU < CPUType::AVX512VNNI) return 0;
  std::chrono::duration<double> oldAVX512VNNI_nobias = testOld_nobias<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI_nobias += testOld_nobias<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI without bias took: " << oldAVX512VNNI_nobias.count() << " seconds." << std::endl;

  std::chrono::duration<double> oldAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(8, 2048, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(320, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(472, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(248, 256, 256);
          oldAVX512VNNI += testOld<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of AVX512VNNI took: " << oldAVX512VNNI.count() << " seconds." << std::endl;

  std::chrono::duration<double> newTimeAVX512VNNI = testOld<AVX512BW::Kernels8>(1, 64, 8);
  for (int i = 0; i<repeat; i++) {
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(8, 2048, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(320, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(472, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(248, 256, 256);
    newTimeAVX512VNNI += testNew<AVX512VNNI::Kernels8>(200, 256, 256);
  }

  std::cout << repeat << " iterations of Shifted AVX512VNNI took: " << newTimeAVX512VNNI.count() << " seconds." << std::endl;
#endif

}